

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O1

bool __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
          (RecursiveMaximumLikelihoodParameterGeneration *this,
          vector<double,_std::allocator<double>_> *smoothed_static_parameters)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  pointer pvVar9;
  bool bVar10;
  size_type sVar11;
  ulong uVar12;
  long lVar13;
  size_type __new_size;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  bVar10 = false;
  if ((smoothed_static_parameters != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar10 = false, this->is_valid_ != false)) {
    iVar7 = (*this->input_source_->_vptr_InputSourceInterface[4])();
    if ((char)iVar7 == '\0') {
      pdVar3 = (this->buffer_).static_and_dynamic_parameters.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->buffer_).static_and_dynamic_parameters.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      uVar8 = (ulong)((long)pdVar4 - (long)pdVar3) >> 4;
      lVar13 = (long)(int)uVar8;
      if ((uVar8 & 0xffffffff) != 0) {
        memset(pdVar3,0,lVar13 * 8);
      }
      auVar6 = _DAT_00113bd0;
      auVar5 = _DAT_00113bc0;
      if (pdVar3 + lVar13 != pdVar4) {
        uVar12 = (long)pdVar4 + (-8 - (long)(pdVar3 + lVar13));
        auVar16._8_4_ = (int)uVar12;
        auVar16._0_8_ = uVar12;
        auVar16._12_4_ = (int)(uVar12 >> 0x20);
        auVar14._0_8_ = uVar12 >> 3;
        auVar14._8_8_ = auVar16._8_8_ >> 3;
        uVar8 = 0;
        auVar14 = auVar14 ^ _DAT_00113bd0;
        do {
          auVar15._8_4_ = (int)uVar8;
          auVar15._0_8_ = uVar8;
          auVar15._12_4_ = (int)(uVar8 >> 0x20);
          auVar16 = (auVar15 | auVar5) ^ auVar6;
          if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                      auVar14._4_4_ < auVar16._4_4_) & 1)) {
            pdVar3[lVar13 + uVar8] = 1.79769313486232e+308;
          }
          if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
              auVar16._12_4_ <= auVar14._12_4_) {
            pdVar3[lVar13 + uVar8 + 1] = 1.79769313486232e+308;
          }
          uVar8 = uVar8 + 2;
        } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
      }
      if (this->num_remaining_frame_ < 2) {
        return false;
      }
      this->num_remaining_frame_ = this->num_remaining_frame_ + -1;
    }
    Forward(this);
    iVar7 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])();
    __new_size = (size_type)iVar7;
    if ((long)(smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(smoothed_static_parameters,__new_size);
    }
    bVar10 = true;
    if (0 < iVar7) {
      pdVar3 = (smoothed_static_parameters->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = this->num_past_frame_;
      iVar7 = this->current_frame_;
      iVar2 = this->calculation_field_;
      pvVar9 = (this->buffer_).c.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = 0;
      do {
        pdVar3[sVar11] =
             *(double *)
              (*(long *)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + (long)((int)(~uVar1 + iVar7) % iVar2) * 8);
        sVar11 = sVar11 + 1;
        pvVar9 = pvVar9 + 1;
      } while (__new_size != sVar11);
    }
  }
  return bVar10;
}

Assistant:

bool RecursiveMaximumLikelihoodParameterGeneration::Get(
    std::vector<double>* smoothed_static_parameters) {
  if (!is_valid_ || NULL == smoothed_static_parameters) {
    return false;
  }

  if (!input_source_->Get(&buffer_.static_and_dynamic_parameters)) {
    const int static_and_dynamic_size(
        static_cast<int>(buffer_.static_and_dynamic_parameters.size() / 2));
    // Unobserbed mean is zero.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin(),
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        0.0);
    // Unobserved variance is infinite.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        buffer_.static_and_dynamic_parameters.end(), kInf);
    if (num_remaining_frame_ <= 1) {
      return false;
    }
    --num_remaining_frame_;
  }
  Forward();

  const int static_size(GetSize());
  if (smoothed_static_parameters->size() !=
      static_cast<std::size_t>(static_size)) {
    smoothed_static_parameters->resize(static_size);
  }

  const int t((current_frame_ - num_past_frame_ - 1) % calculation_field_);
  double* output(&((*smoothed_static_parameters)[0]));
  for (int m(0); m < static_size; ++m) {
    output[m] = buffer_.c[m][t];
  }

  return true;
}